

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component_import.cpp
# Opt level: O2

void __thiscall
ComponentImport_nonExistentUrlAndParse_Test::TestBody
          (ComponentImport_nonExistentUrlAndParse_Test *this)

{
  element_type *peVar1;
  char *pcVar2;
  AssertionResult gtest_ar_4;
  PrinterPtr printer;
  unsigned_long local_b0;
  string a;
  unsigned_long local_88;
  ModelPtr model;
  ParserPtr parser;
  ComponentPtr importedComponent;
  ModelPtr m;
  ImportSourcePtr imp;
  string e;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&e,
             "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"http://someplace.world/cellml/model.xml\">\n    <component component_ref=\"na_channel\" name=\"noble_na_channel\"/>\n  </import>\n</model>\n"
             ,(allocator<char> *)&a);
  libcellml::Model::create();
  libcellml::ImportSource::create();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"http://someplace.world/cellml/model.xml",(allocator<char> *)&gtest_ar_4);
  libcellml::ImportSource::setUrl
            ((string *)
             imp.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__cxx11::string::~string((string *)&a);
  libcellml::Component::create();
  libcellml::ImportedEntity::importSource();
  printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  testing::internal::CmpHelperEQ<std::shared_ptr<libcellml::ImportSource>,decltype(nullptr)>
            ((internal *)&a,"importedComponent->importSource()","nullptr",
             (shared_ptr<libcellml::ImportSource> *)&gtest_ar_4,(void **)&printer);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_4.message_);
  if ((char)a._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (a._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)a._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&printer,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/component_import.cpp"
               ,0x89,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&printer,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&printer);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a._M_string_length);
  peVar1 = importedComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"noble_na_channel",(allocator<char> *)&gtest_ar_4);
  libcellml::NamedEntity::setName((string *)peVar1);
  std::__cxx11::string::~string((string *)&a);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&a,"na_channel",(allocator<char> *)&gtest_ar_4);
  libcellml::Component::setSourceComponent
            ((shared_ptr *)
             importedComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(string *)&imp);
  std::__cxx11::string::~string((string *)&a);
  libcellml::ImportedEntity::importSource();
  testing::internal::
  CmpHelperEQ<std::shared_ptr<libcellml::ImportSource>,std::shared_ptr<libcellml::ImportSource>>
            ((internal *)&a,"importedComponent->importSource()","imp",
             (shared_ptr<libcellml::ImportSource> *)&gtest_ar_4,&imp);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_4.message_);
  if ((char)a._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (a._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)a._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&printer,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/component_import.cpp"
               ,0x8e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&printer,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&printer);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a._M_string_length);
  gtest_ar_4.success_ = false;
  gtest_ar_4._1_7_ = 0;
  printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&a,"size_t(0)","m->componentCount()",(unsigned_long *)&gtest_ar_4,
             (unsigned_long *)&printer);
  if ((char)a._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (a._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)a._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&printer,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/component_import.cpp"
               ,0x90,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&printer,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&printer);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a._M_string_length);
  libcellml::ComponentEntity::addComponent
            ((shared_ptr *)m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            );
  gtest_ar_4.success_ = true;
  gtest_ar_4._1_7_ = 0;
  printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&a,"size_t(1)","m->componentCount()",(unsigned_long *)&gtest_ar_4,
             (unsigned_long *)&printer);
  if ((char)a._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&gtest_ar_4);
    if (a._M_string_length == 0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)a._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&printer,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/component_import.cpp"
               ,0x92,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&printer,(Message *)&gtest_ar_4);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&printer);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_4);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)&a._M_string_length);
  libcellml::Printer::create();
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&a,
             SUB81(printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ,0));
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_4,"e","a",&e,&a);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&parser);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&model,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/component_import.cpp"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&model,(Message *)&parser);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&model);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&parser);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Parser::parseModel((string *)&model);
  local_b0 = 1;
  local_88 = libcellml::ComponentEntity::componentCount();
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar_4,"size_t(1)","model->componentCount()",&local_b0,&local_88);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/component_import.cpp"
               ,0x9b,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  libcellml::Printer::printModel_abi_cxx11_
            ((shared_ptr *)&gtest_ar_4,
             SUB81(printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                   ,0));
  std::__cxx11::string::operator=((string *)&a,(string *)&gtest_ar_4);
  std::__cxx11::string::~string((string *)&gtest_ar_4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,std::__cxx11::string>
            ((internal *)&gtest_ar_4,"e","a",&e,&a);
  if (gtest_ar_4.success_ == false) {
    testing::Message::Message((Message *)&local_b0);
    if (gtest_ar_4.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar_4.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/model/component_import.cpp"
               ,0x9d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_88,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_88);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_b0);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_4.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&a);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&printer.super___shared_ptr<libcellml::Printer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&importedComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&imp.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&m.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__cxx11::string::~string((string *)&e);
  return;
}

Assistant:

TEST(ComponentImport, nonExistentUrlAndParse)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <import xmlns:xlink=\"http://www.w3.org/1999/xlink\" xlink:href=\"http://someplace.world/cellml/model.xml\">\n"
        "    <component component_ref=\"na_channel\" name=\"noble_na_channel\"/>\n"
        "  </import>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ImportSourcePtr imp = libcellml::ImportSource::create();
    imp->setUrl("http://someplace.world/cellml/model.xml");

    libcellml::ComponentPtr importedComponent = libcellml::Component::create();

    EXPECT_EQ(importedComponent->importSource(), nullptr);

    importedComponent->setName("noble_na_channel");
    importedComponent->setSourceComponent(imp, "na_channel");

    EXPECT_EQ(importedComponent->importSource(), imp);

    EXPECT_EQ(size_t(0), m->componentCount());
    m->addComponent(importedComponent);
    EXPECT_EQ(size_t(1), m->componentCount());

    libcellml::PrinterPtr printer = libcellml::Printer::create();
    std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);

    // Parse
    libcellml::ParserPtr parser = libcellml::Parser::create();
    libcellml::ModelPtr model = parser->parseModel(e);
    EXPECT_EQ(size_t(1), model->componentCount());
    a = printer->printModel(model);
    EXPECT_EQ(e, a);
}